

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O1

int __thiscall
CECoordinates::CIRS2Observed
          (CECoordinates *this,double ra,double dec,double *az,double *zen,double julian_date,
          double longitude,double latitude,double elevation_m,double pressure_hPa,
          double temperature_celsius,double relative_humidity,double dut1,double xp,double yp,
          double wavelength_um,double *observed_ra,double *observed_dec,double *hour_angle)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double temp_hour_angle;
  double temp_dec;
  double temp_ra;
  CEDate date;
  double local_c8;
  double local_c0;
  double local_b8;
  CEDate local_b0 [2];
  
  local_b8 = 0.0;
  local_c0 = 0.0;
  local_c8 = 0.0;
  CEDate::CEDate(local_b0,julian_date,JD);
  pdVar4 = &local_c8;
  if (observed_dec != (double *)0x0) {
    pdVar4 = observed_dec;
  }
  pdVar2 = &local_c0;
  if (observed_ra != (double *)0x0) {
    pdVar2 = observed_ra;
  }
  pdVar3 = &local_b8;
  if (zen != (double *)0x0) {
    pdVar3 = zen;
  }
  dVar5 = CEDate::GetMJD2JDFactor();
  dVar6 = CEDate::MJD(local_b0);
  iVar1 = iauAtio13(ra,dec,dVar5,SUB84(dVar6,0),dut1,longitude,latitude,elevation_m,this,az,pdVar4,
                    pdVar2,pdVar3);
  CEDate::~CEDate(local_b0);
  return iVar1;
}

Assistant:

int CECoordinates::CIRS2Observed(double ra, double dec,
                                 double *az, double *zen,
                                 double julian_date,
                                 double longitude,
                                 double latitude,
                                 double elevation_m,
                                 double pressure_hPa,
                                 double temperature_celsius,
                                 double relative_humidity,
                                 double dut1,
                                 double xp, double yp,
                                 double wavelength_um,
                                 double *observed_ra,
                                 double *observed_dec,
                                 double *hour_angle)
{
    // Setup the observed RA, Dec and hour_angle variables
    double temp_ra(0.0);
    double temp_dec(0.0);
    double temp_hour_angle(0.0);

    // If values were not passed, point them at the temporary ones
    if (observed_ra  == nullptr) observed_ra  = &temp_ra;
    if (observed_dec == nullptr) observed_dec = &temp_dec;
    if (hour_angle   == nullptr) hour_angle   = &temp_hour_angle;

    // Call the necessary sofa method
    int err_code = 0;
    try {
        CEDate date(julian_date, CEDateType::JD);
        err_code = iauAtio13(ra, dec,
                             CEDate::GetMJD2JDFactor(), date.MJD(),
                             dut1,
                             longitude,
                             latitude,
                             elevation_m,
                             xp, yp,
                             pressure_hPa,
                             temperature_celsius,
                             relative_humidity,
                             wavelength_um,
                             az, zen,
                             hour_angle, 
                             observed_dec, 
                             observed_ra) ;
    } catch (std::exception &e) {
        throw CEException::sofa_exception("CECoordinates::CIRS2Observed",
                                          "iauAtio13",
                                          e.what());
    }

    return err_code ;
}